

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

int Fraig_ManPrintRefs(Fraig_Man_t *pMan)

{
  Fraig_Node_t *pNode2;
  int iVar1;
  Fraig_NodeVec_t *p;
  Fraig_Node_t *pNew;
  long lVar2;
  Fraig_Node_t *pFVar3;
  long lVar4;
  long lVar5;
  uint local_58;
  uint local_54;
  timespec local_40;
  
  p = Fraig_NodeVecAlloc(1000);
  lVar4 = 0;
  while( true ) {
    lVar2 = (long)pMan->vNodes->nSize;
    if (lVar2 <= lVar4) break;
    pFVar3 = pMan->vNodes->pArray[lVar4];
    if (((0xfff < *(uint *)&pFVar3->field_0x18) &&
        (*(uint *)&pFVar3->field_0x18 >> 0xc != pMan->nWordsRand << 5)) && (5 < pFVar3->nRefs)) {
      Fraig_NodeVecPush(p,pFVar3);
    }
    lVar4 = lVar4 + 1;
  }
  printf("Total nodes = %d. Referenced nodes = %d.\n",lVar2,(ulong)(uint)p->nSize);
  clock_gettime(3,&local_40);
  iVar1 = p->nSize;
  lVar4 = 1;
  local_54 = 0;
  local_58 = 0;
  for (lVar2 = 0; lVar5 = lVar4, lVar2 < iVar1; lVar2 = lVar2 + 1) {
    for (; (int)lVar5 < iVar1; lVar5 = lVar5 + 1) {
      pFVar3 = p->pArray[lVar2];
      pNode2 = p->pArray[lVar5];
      iVar1 = Fraig_NodeSimsContained(pMan,pFVar3,pNode2);
      pNew = pNode2;
      if ((iVar1 != 0) ||
         (iVar1 = Fraig_NodeSimsContained(pMan,pNode2,pFVar3), pNew = pFVar3, pFVar3 = pNode2,
         iVar1 != 0)) {
        iVar1 = Fraig_NodeIsImplication(pMan,pFVar3,pNew,-1);
        local_58 = (local_58 + 1) - (uint)(iVar1 == 0);
        local_54 = local_54 + 1;
      }
      iVar1 = p->nSize;
    }
    lVar4 = lVar4 + 1;
  }
  printf("Number of candidate pairs = %d.  Proved = %d.\n",(ulong)local_54,(ulong)local_58);
  return 0;
}

Assistant:

int Fraig_ManPrintRefs( Fraig_Man_t * pMan )
{
    Fraig_NodeVec_t * vPivots;
    Fraig_Node_t * pNode, * pNode2;
    int i, k, Counter, nProved;
    abctime clk;

    vPivots = Fraig_NodeVecAlloc( 1000 );
    for ( i = 0; i < pMan->vNodes->nSize; i++ )
    {
        pNode = pMan->vNodes->pArray[i];

        if ( pNode->nOnes == 0 || pNode->nOnes == (unsigned)pMan->nWordsRand * 32 )
            continue;

        if ( pNode->nRefs > 5 )
        {
            Fraig_NodeVecPush( vPivots, pNode );
//            printf( "Node %6d : nRefs = %2d   Level = %3d.\n", pNode->Num, pNode->nRefs, pNode->Level );
        }
    }
    printf( "Total nodes = %d. Referenced nodes = %d.\n", pMan->vNodes->nSize, vPivots->nSize );

clk = Abc_Clock();
    // count implications
    Counter = nProved = 0;
    for ( i = 0; i < vPivots->nSize; i++ )
        for ( k = i+1; k < vPivots->nSize; k++ )
        {
            pNode  = vPivots->pArray[i];
            pNode2 = vPivots->pArray[k];
            if ( Fraig_NodeSimsContained( pMan, pNode, pNode2 ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode, pNode2, -1 ) )
                    nProved++;
                Counter++;
            }
            else if ( Fraig_NodeSimsContained( pMan, pNode2, pNode ) )
            {
                if ( Fraig_NodeIsImplication( pMan, pNode2, pNode, -1 ) )
                    nProved++;
                Counter++;
            }
        }
    printf( "Number of candidate pairs = %d.  Proved = %d.\n", Counter, nProved );
//ABC_PRT( "Time", Abc_Clock() - clk );
    return 0;
}